

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

size_type __thiscall ghc::filesystem::path::root_name_length(path *this)

{
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  
  if ((this->_path)._M_string_length < 3) {
    return 0;
  }
  pcVar1 = (this->_path)._M_dataplus._M_p;
  if ((((*pcVar1 == '/') && (pcVar1[1] == '/')) && (pcVar1[2] != 0x2f)) &&
     (iVar2 = isprint((int)pcVar1[2]), iVar2 != 0)) {
    sVar3 = std::__cxx11::string::find((char)this,0x2f);
    if (sVar3 != 0xffffffffffffffff) {
      return sVar3;
    }
    return (this->_path)._M_string_length;
  }
  return 0;
}

Assistant:

GHC_INLINE path::string_type::size_type path::root_name_length() const noexcept
{
#ifdef GHC_OS_WINDOWS
    if (_path.length() >= _prefixLength + 2 && std::toupper(static_cast<unsigned char>(_path[_prefixLength])) >= 'A' && std::toupper(static_cast<unsigned char>(_path[_prefixLength])) <= 'Z' && _path[_prefixLength + 1] == ':') {
        return 2;
    }
#endif
    if (_path.length() > _prefixLength + 2 && _path[_prefixLength] == preferred_separator && _path[_prefixLength + 1] == preferred_separator && _path[_prefixLength + 2] != preferred_separator && std::isprint(_path[_prefixLength + 2])) {
        impl_string_type::size_type pos = _path.find(preferred_separator, _prefixLength + 3);
        if (pos == impl_string_type::npos) {
            return _path.length();
        }
        else {
            return pos;
        }
    }
    return 0;
}